

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestAllExtensionsLite::_InternalSerialize
          (TestAllExtensionsLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  TestAllExtensionsLite *extendee;
  void *data;
  uint32_t cached_has_bits;
  TestAllExtensionsLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestAllExtensionsLite *this_local;
  
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,&extendee->super_MessageLite,target
                            ,stream);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestAllExtensionsLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestAllExtensionsLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestAllExtensionsLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestAllExtensionsLite)
  return target;
}